

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

bool __thiscall
xscript::parser::ast::parse_expression
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent,int precedence)

{
  uint uVar1;
  token_t_conflict tVar2;
  bool bVar3;
  int precedence_00;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ast *paVar7;
  token_t t;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  int local_34;
  
  tVar2 = (this->cur_token).type;
  uVar1 = tVar2 - TK_SUB;
  paVar7 = this;
  local_34 = precedence;
  if (((uVar1 < 0x3a) && ((0x200000003800041U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
     (tVar2 == TK_CO)) {
    puVar4 = ast_node::add_child((parent->_M_t).
                                 super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                 .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                 _M_head_impl,UNARY_EXPRESSION);
    parse_token(this,puVar4);
    bVar3 = parse_expression(this,puVar4,2);
  }
  else {
    bVar3 = parse_basic_expression(this,parent);
  }
  if (bVar3 == false) {
LAB_0011896f:
    bVar3 = false;
  }
  else {
    t = (this->cur_token).type;
    precedence_00 = operator_precedence(paVar7,t);
    bVar3 = true;
    if (-1 < precedence_00) {
      local_50 = &local_60;
      do {
        if (t - TK_ASSIGN < 0xd) {
          if (local_34 < precedence_00) break;
        }
        else if (local_34 <= precedence_00) break;
        puVar4 = ast_node::replace_child
                           ((parent->_M_t).
                            super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                            .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl,
                            BINARY_EXPRESSION);
        parse_token(this,puVar4);
        uVar6 = this;
        if (t == TK_LEFT_BRACK) {
          if ((this->cur_token).type != TK_RIGHT_BRACK) {
            bVar3 = parse_expression(this,puVar4,0xf);
            if (!bVar3) goto LAB_0011896f;
            if ((this->cur_token).type != TK_RIGHT_BRACK) {
              local_48._M_len = 0x36;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              local_90._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_48);
              local_90.field_2._M_allocated_capacity = local_48._M_len;
              *(undefined8 *)local_90._M_dataplus._M_p = 0x334f5f646c697562;
              builtin_strncpy((char *)((long)local_90._M_dataplus._M_p + 8),"/src/CMa",8);
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_90._M_dataplus._M_p + 0x10))->_M_allocated_capacity =
                   0x2f73656c6946656b;
              builtin_strncpy((char *)((long)local_90._M_dataplus._M_p + 0x18),"xscript.",8);
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x20) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x21) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x22) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x23) = '/';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x24) = 'c';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x25) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x26) = 'm';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x27) = 'p';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x28) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x29) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2a) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2b) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2c) = '_';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2d) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2e) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2f) = 'p';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2e) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x2f) = 'p';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x30) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x31) = 'n';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x32) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x33) = '.';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x34) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p + 0x35) = 's';
              local_90._M_string_length = local_48._M_len;
              local_90._M_dataplus._M_p[local_48._M_len] = '\0';
              local_48._M_len = 0xc;
              local_48._M_str = "\']\' expected";
              args_00._M_len = 1;
              args_00._M_array = &local_48;
              append_syntax_error(this,&local_90,0x251,args_00);
              uVar5 = local_90.field_2._M_allocated_capacity;
              uVar6 = local_90._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00118949;
              goto LAB_00118951;
            }
          }
LAB_0011887b:
          next(this);
        }
        else if (t == TK_LEFT_PAREN) {
          bVar3 = parse_function_call_parameter(this,puVar4);
          if (!bVar3) goto LAB_0011896f;
          if ((this->cur_token).type == TK_RIGHT_PAREN) goto LAB_0011887b;
          local_48._M_len = 0x36;
          local_70._M_allocated_capacity = (size_type)&local_60;
          local_70._M_allocated_capacity =
               std::__cxx11::string::_M_create(&local_70._M_allocated_capacity,(ulong)&local_48);
          local_60._M_allocated_capacity = local_48._M_len;
          *(undefined8 *)local_70._M_allocated_capacity = 0x334f5f646c697562;
          builtin_strncpy((char *)(local_70._M_allocated_capacity + 8),"/src/CMa",8);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_70._M_allocated_capacity + 0x10))->_M_allocated_capacity = 0x2f73656c6946656b;
          builtin_strncpy((char *)(local_70._M_allocated_capacity + 0x18),"xscript.",8);
          *(char *)(local_70._M_allocated_capacity + 0x20) = 'd';
          *(char *)(local_70._M_allocated_capacity + 0x21) = 'i';
          *(char *)(local_70._M_allocated_capacity + 0x22) = 'r';
          *(char *)(local_70._M_allocated_capacity + 0x23) = '/';
          *(char *)(local_70._M_allocated_capacity + 0x24) = 'c';
          *(char *)(local_70._M_allocated_capacity + 0x25) = 'o';
          *(char *)(local_70._M_allocated_capacity + 0x26) = 'm';
          *(char *)(local_70._M_allocated_capacity + 0x27) = 'p';
          *(char *)(local_70._M_allocated_capacity + 0x28) = 'i';
          *(char *)(local_70._M_allocated_capacity + 0x29) = 'l';
          *(char *)(local_70._M_allocated_capacity + 0x2a) = 'e';
          *(char *)(local_70._M_allocated_capacity + 0x2b) = 'r';
          *(char *)(local_70._M_allocated_capacity + 0x2c) = '_';
          *(char *)(local_70._M_allocated_capacity + 0x2d) = 'd';
          *(char *)(local_70._M_allocated_capacity + 0x2e) = 'e';
          *(char *)(local_70._M_allocated_capacity + 0x2f) = 'p';
          *(char *)(local_70._M_allocated_capacity + 0x2e) = 'e';
          *(char *)(local_70._M_allocated_capacity + 0x2f) = 'p';
          *(char *)(local_70._M_allocated_capacity + 0x30) = 'e';
          *(char *)(local_70._M_allocated_capacity + 0x31) = 'n';
          *(char *)(local_70._M_allocated_capacity + 0x32) = 'd';
          *(char *)(local_70._M_allocated_capacity + 0x33) = '.';
          *(char *)(local_70._M_allocated_capacity + 0x34) = 't';
          *(char *)(local_70._M_allocated_capacity + 0x35) = 's';
          local_70._8_8_ = local_48._M_len;
          *(char *)(local_70._M_allocated_capacity + local_48._M_len) = '\0';
          local_48._M_len = 0xc;
          local_48._M_str = "\')\' expected";
          args._M_len = 1;
          args._M_array = &local_48;
          append_syntax_error(this,(string *)&local_70,0x245,args);
          uVar5 = local_60._M_allocated_capacity;
          uVar6 = local_70._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_allocated_capacity != &local_60) {
LAB_00118949:
            operator_delete((void *)uVar6,uVar5 + 1);
          }
        }
        else {
          bVar3 = parse_expression(this,puVar4,precedence_00);
          if (!bVar3) goto LAB_0011896f;
        }
LAB_00118951:
        t = (this->cur_token).type;
        precedence_00 = operator_precedence((ast *)uVar6,t);
      } while (-1 < precedence_00);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool ast::parse_expression(std::unique_ptr<ast_node>& parent, int precedence) {
    switch (cur_token.type) {
        case tokenizer::TK_LOGIC_NOT: // 逻辑非运算符
        case tokenizer::TK_BITWISE_NOT: // 按位取反运算符
        case tokenizer::TK_SUB: // 负号运算符
        case tokenizer::TK_INC: // 自增运算符
        case tokenizer::TK_DEC: // 自减运算符
        case tokenizer::TK_CO:  // 协程运算符
        case tokenizer::TK_TYPEOF: // 类型运算符
        {
            std::unique_ptr<ast_node>& unary_expression = parent->add_child(UNARY_EXPRESSION);
            if (!parse_token(unary_expression)) {
                return false;
            } 
            if (!parse_expression(unary_expression, 2)) {
                return false;
            }
            break;
        }
        default:
            if (!parse_basic_expression(parent)) {
                return false;
            }
    }

    int p = operator_precedence(cur_token.type);
    while (true) {
        if (p < 0) {
            return true;
        } else {
            switch (cur_token.type) {
                case tokenizer::TK_LOGIC_AND:
                case tokenizer::TK_LOGIC_OR:
                case tokenizer::TK_ASSIGN:
                case tokenizer::TK_ASSIGN_ADD:
                case tokenizer::TK_ASSIGN_SUB:
                case tokenizer::TK_ASSIGN_MUL:
                case tokenizer::TK_ASSIGN_DIV:
                case tokenizer::TK_ASSIGN_MOD:
                case tokenizer::TK_ASSIGN_AND:
                case tokenizer::TK_ASSIGN_OR:
                case tokenizer::TK_ASSIGN_XOR:
                case tokenizer::TK_ASSIGN_SHL:
                case tokenizer::TK_ASSIGN_SHR:
                    // 右结合操作符
                    if (p > precedence) {
                        return true;
                    }
                    break;
                default:
                    // 左结合操作符
                    if (p >= precedence) {
                        return true;
                    }
            }
        }

        tokenizer::token_t t = cur_token.type;

        std::unique_ptr<ast_node>& binary_expression = parent->replace_child(BINARY_EXPRESSION);
        if (!parse_token(binary_expression)) {
            return false;
        }

        if (t == tokenizer::TK_LEFT_PAREN) {
            if (!parse_function_call_parameter(binary_expression)) {
                return false;
            }

            if (cur_token != tokenizer::TK_RIGHT_PAREN) {
                syntax_error({"')' expected"});
            } else {
                next();
            }
        } else if (t == tokenizer::TK_LEFT_BRACK) {
            if (cur_token != tokenizer::TK_RIGHT_BRACK) {
                if (!parse_expression(binary_expression)) {
                    return false;
                }
            }

            if (cur_token != tokenizer::TK_RIGHT_BRACK) {
                syntax_error({"']' expected"});
            } else {
                next();
            }
        } else {
            if (!parse_expression(binary_expression, p)) {
                return false;
            }
        }

        p = operator_precedence(cur_token.type);
    }
}